

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O0

int eeprom_writealias(int slave,int alias,uint16 crc)

{
  int local_24;
  undefined1 local_1f;
  short local_1e;
  int ret;
  uint8 eepctl;
  uint16 aiadr;
  int wkc;
  int iStack_10;
  uint16 crc_local;
  int alias_local;
  int slave_local;
  
  if (((_ec_slavecount < slave) || (slave < 1)) || (0xffff < alias)) {
    alias_local = 0;
  }
  else {
    local_1e = 1 - (short)slave;
    local_1f = 2;
    aiadr = crc;
    wkc = alias;
    iStack_10 = slave;
    ret = ec_APWR(local_1e,0x500,1,&local_1f,2000);
    local_1f = 0;
    ret = ec_APWR(local_1e,0x500,1,&local_1f,2000);
    local_24 = ec_writeeepromAP(local_1e,4,wkc & 0xffff,20000);
    if (local_24 != 0) {
      local_24 = ec_writeeepromAP(local_1e,7,aiadr,20000);
    }
    alias_local = local_24;
  }
  return alias_local;
}

Assistant:

int eeprom_writealias(int slave, int alias, uint16 crc)
{
   int wkc;
   uint16 aiadr;
   uint8 eepctl;
   int ret;
   
   if((ec_slavecount >= slave) && (slave > 0) && (alias <= 0xffff))
   {
      aiadr = 1 - slave;
      eepctl = 2;
      wkc = ec_APWR(aiadr, ECT_REG_EEPCFG, sizeof(eepctl), &eepctl , EC_TIMEOUTRET); /* force Eeprom from PDI */
      eepctl = 0;
      wkc = ec_APWR(aiadr, ECT_REG_EEPCFG, sizeof(eepctl), &eepctl , EC_TIMEOUTRET); /* set Eeprom to master */

      ret = ec_writeeepromAP(aiadr, 0x04 , alias, EC_TIMEOUTEEP);
      if (ret)
        ret = ec_writeeepromAP(aiadr, 0x07 , crc, EC_TIMEOUTEEP);
        
      return ret;
   }
   
   return 0;
}